

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_function_info.cpp
# Opt level: O3

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateTableFunctionInfo::Copy(CreateTableFunctionInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  type other;
  pointer *__ptr;
  CreateFunctionInfo *in_RSI;
  TableFunctionSet set;
  _Head_base<0UL,_duckdb::CreateTableFunctionInfo_*,_false> local_c8;
  TableFunctionSet local_c0;
  string local_88;
  TableFunctionSet local_68;
  
  pcVar3 = (in_RSI->name)._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,pcVar3 + (in_RSI->name)._M_string_length);
  TableFunctionSet::TableFunctionSet(&local_c0,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::operator=
            (&local_c0.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>,
             (vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_> *)
             &in_RSI[1].super_CreateInfo.catalog.field_2);
  local_c8._M_head_impl = (CreateTableFunctionInfo *)operator_new(0x1b8);
  paVar1 = &local_68.super_FunctionSet<duckdb::TableFunction>.name.field_2;
  paVar2 = &local_c0.super_FunctionSet<duckdb::TableFunction>.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p == paVar2) {
    local_68.super_FunctionSet<duckdb::TableFunction>.name.field_2._8_8_ =
         local_c0.super_FunctionSet<duckdb::TableFunction>.name.field_2._8_8_;
    local_68.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p =
         local_c0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p;
  }
  local_68.super_FunctionSet<duckdb::TableFunction>.name._M_string_length =
       local_c0.super_FunctionSet<duckdb::TableFunction>.name._M_string_length;
  local_c0.super_FunctionSet<duckdb::TableFunction>.name._M_string_length = 0;
  local_c0.super_FunctionSet<duckdb::TableFunction>.name.field_2._M_local_buf[0] = '\0';
  local_68.super_FunctionSet<duckdb::TableFunction>.functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_c0.super_FunctionSet<duckdb::TableFunction>.functions.
       super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
       super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super_FunctionSet<duckdb::TableFunction>.functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c0.super_FunctionSet<duckdb::TableFunction>.functions.
       super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
       super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super_FunctionSet<duckdb::TableFunction>.functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_c0.super_FunctionSet<duckdb::TableFunction>.functions.
       super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
       super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_c0.super_FunctionSet<duckdb::TableFunction>.functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.super_FunctionSet<duckdb::TableFunction>.functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.super_FunctionSet<duckdb::TableFunction>.functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = (pointer)paVar2;
  CreateTableFunctionInfo(local_c8._M_head_impl,&local_68);
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_68.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  other = unique_ptr<duckdb::CreateTableFunctionInfo,_std::default_delete<duckdb::CreateTableFunctionInfo>,_true>
          ::operator*((unique_ptr<duckdb::CreateTableFunctionInfo,_std::default_delete<duckdb::CreateTableFunctionInfo>,_true>
                       *)&local_c8);
  CreateFunctionInfo::CopyFunctionProperties(in_RSI,&other->super_CreateFunctionInfo);
  (this->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_c8._M_head_impl;
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&local_c0.super_FunctionSet<duckdb::TableFunction>.functions.
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_c0.super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)this;
}

Assistant:

unique_ptr<CreateInfo> CreateTableFunctionInfo::Copy() const {
	TableFunctionSet set(name);
	set.functions = functions.functions;
	auto result = make_uniq<CreateTableFunctionInfo>(std::move(set));
	CopyFunctionProperties(*result);
	return std::move(result);
}